

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_parse_destructuring_element
              (JSParseState *s,int tok,int is_arg,int hasval,int has_ellipsis,BOOL allow_initializer
              )

{
  LabelSlot *pLVar1;
  size_t sVar2;
  JSAtomStruct *pJVar3;
  JSFunctionDef *pJVar4;
  bool bVar5;
  JSAtom JVar6;
  uint8_t uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int is_arg_00;
  int is_arg_01;
  int extraout_EDX;
  int extraout_EDX_00;
  undefined8 extraout_RDX;
  undefined8 uVar11;
  undefined8 extraout_RDX_00;
  char *pcVar12;
  int tok_00;
  ulong uVar13;
  uint8_t val;
  char cVar14;
  JSAtom var_name;
  JSAtom prop_name;
  int opcode;
  int depth_lvalue;
  int scope;
  int local_94;
  int label_lvalue;
  int local_8c;
  int local_88;
  int local_84;
  int skip_bits;
  int local_7c;
  ulong local_78;
  BOOL local_6c;
  size_t local_68;
  size_t local_60;
  BlockEnv local_58;
  
  uVar13 = (ulong)(uint)tok;
  local_94 = is_arg;
  local_6c = allow_initializer;
  if (has_ellipsis < 0) {
    js_parse_skip_parens_token(s,&skip_bits,0);
    has_ellipsis = skip_bits & 2;
  }
  iVar8 = new_label_fd(s->cur_func,-1);
  iVar9 = new_label_fd(s->cur_func,-1);
  local_60 = (s->cur_func->byte_code).size;
  if (hasval == 0) {
    emit_goto(s,0x6b,iVar8);
    emit_label(s,iVar9);
    emit_op(s,'\x11');
  }
  else {
    emit_op(s,'\x11');
    emit_op(s,'\x06');
    emit_op(s,0xab);
    emit_goto(s,0x6a,iVar8);
    emit_label(s,iVar9);
  }
  sVar2 = (s->cur_func->byte_code).size;
  iVar10 = (s->token).val;
  if (iVar10 == 0x5b) {
    local_88 = hasval;
    local_84 = iVar8;
    local_7c = iVar9;
    local_68 = sVar2;
    iVar8 = next_token(s);
    cVar14 = '\x01';
    if (iVar8 == 0) {
      pJVar4 = s->cur_func;
      local_58.prev = pJVar4->top_break;
      pJVar4->top_break = &local_58;
      local_58.label_name = 0;
      local_58.label_break = -1;
      local_58.label_cont = -1;
      local_58.drop_count = 2;
      local_58.label_finally = -1;
      local_58.scope_level = pJVar4->scope_level;
      local_58.has_iterator = 1;
      emit_op(s,'}');
      uVar11 = extraout_RDX;
      do {
        iVar9 = (int)uVar11;
        iVar8 = (s->token).val;
        if (iVar8 == 0x5d) {
LAB_001592da:
          emit_op(s,0x83);
          s->cur_func->top_break = s->cur_func->top_break->prev;
          iVar8 = next_token(s);
          cVar14 = iVar8 != 0;
          goto LAB_00158dd0;
        }
        if (iVar8 == -0x5b) {
          iVar9 = next_token(s);
          cVar14 = '\x01';
          if (iVar9 != 0) goto LAB_00158dd0;
          iVar10 = (s->token).val;
          if ((iVar10 == 0x5d) || (iVar9 = extraout_EDX, iVar10 == 0x2c)) {
            js_parse_error(s,"missing binding pattern...");
            goto LAB_00158dd0;
          }
        }
        iVar10 = (s->token).val;
        tok_00 = (int)uVar13;
        if ((iVar10 == 0x7b) || (iVar10 == 0x5b)) {
          iVar10 = js_parse_skip_parens_token(s,&skip_bits,0);
          iVar9 = extraout_EDX_00;
          if ((0x31 < iVar10 - 0x2cU) ||
             (iVar9 = 0x20001, (0x2000000020001U >> ((ulong)(iVar10 - 0x2cU) & 0x3f) & 1) == 0))
          goto LAB_00158f4e;
          if (iVar8 != -0x5b) {
            emit_op(s,0x80);
            dbuf_putc(&s->cur_func->byte_code,'\0');
            emit_op(s,'\x0e');
LAB_00158fd9:
            cVar14 = '\x01';
            iVar9 = js_parse_destructuring_element(s,tok_00,local_94,1,skip_bits & 2,1);
            if (-1 < iVar9) goto LAB_00159158;
            goto LAB_00158dd0;
          }
          if (iVar10 != 0x3d) {
            js_emit_spread_code(s,0);
            goto LAB_00158fd9;
          }
          pcVar12 = "rest element cannot have a default value";
LAB_0015934b:
          js_parse_error(s,pcVar12);
          break;
        }
        if (iVar10 == 0x2c) {
          emit_op(s,0x80);
          dbuf_putc(&s->cur_func->byte_code,'\0');
          emit_op(s,'\x0e');
          emit_op(s,'\x0e');
        }
        else {
LAB_00158f4e:
          var_name = 0;
          depth_lvalue = 0;
          if (tok_00 == 0) {
            iVar9 = js_parse_postfix_expr(s,2);
            cVar14 = '\x01';
            if ((iVar9 != 0) ||
               (iVar9 = get_lvalue(s,&opcode,&scope,&var_name,&label_lvalue,&depth_lvalue,0,0x5b),
               iVar9 != 0)) goto LAB_00158dd0;
          }
          else {
            var_name = js_parse_destructuring_var(s,local_94,iVar9);
            cVar14 = '\x04';
            if ((var_name == 0) || (iVar9 = js_define_var(s,var_name,tok_00), iVar9 != 0))
            goto LAB_00158dd0;
            opcode = 0xb6;
            scope = s->cur_func->scope_level;
          }
          if (iVar8 == -0x5b) {
            js_emit_spread_code(s,depth_lvalue);
          }
          else {
            emit_op(s,0x80);
            dbuf_putc(&s->cur_func->byte_code,(uint8_t)depth_lvalue);
            emit_op(s,'\x0e');
            if ((s->token).val == 0x3d) {
              local_78 = uVar13;
              emit_op(s,'\x11');
              emit_op(s,'\x06');
              emit_op(s,0xab);
              iVar9 = emit_goto(s,0x69,-1);
              iVar10 = next_token(s);
              cVar14 = '\x04';
              if (iVar10 == 0) {
                local_8c = iVar9;
                emit_op(s,'\x0e');
                iVar9 = js_parse_assign_expr2(s,1);
                if (iVar9 != 0) goto LAB_00159121;
                if ((opcode == 0xb6) || (opcode == 0x3c)) {
                  set_object_name(s,var_name);
                }
                emit_label(s,local_8c);
                cVar14 = '\0';
                bVar5 = true;
              }
              else {
LAB_00159121:
                bVar5 = false;
              }
              uVar13 = local_78;
              if (!bVar5) goto LAB_00158dd0;
            }
          }
          put_lvalue(s,opcode,scope,var_name,label_lvalue,PUT_LVALUE_NOKEEP_DEPTH,
                     (uint)((tok + 0x37U & 0xfffffff7) == 0));
        }
LAB_00159158:
        if ((s->token).val == 0x5d) goto LAB_001592da;
        if (iVar8 == -0x5b) {
          pcVar12 = "rest element must be the last one";
          goto LAB_0015934b;
        }
        iVar8 = js_parse_expect(s,0x2c);
        uVar11 = extraout_RDX_00;
      } while (iVar8 == 0);
      cVar14 = '\x01';
    }
LAB_00158dd0:
    if (cVar14 != '\0') {
      if (cVar14 != '\x04') {
        return -1;
      }
switchD_00158d7a_caseD_4:
      JS_FreeAtom(s->ctx,var_name);
      return -1;
    }
LAB_001591eb:
    iVar8 = local_84;
    if ((local_6c != 0) && ((s->token).val == 0x3d)) {
      iVar8 = emit_goto(s,0x6b,-1);
      iVar9 = next_token(s);
      if (iVar9 != 0) {
        return -1;
      }
      emit_label(s,local_84);
      if (local_88 != 0) {
        emit_op(s,'\x0e');
      }
      iVar9 = js_parse_assign_expr2(s,1);
      if (iVar9 == 0) {
        emit_goto(s,0x6b,local_7c);
        emit_label(s,iVar8);
        return 1;
      }
      return -1;
    }
    if (local_88 != 0) {
      memset((s->cur_func->byte_code).buf + (int)local_60,0xb1,(long)((int)local_68 - (int)local_60)
            );
      pLVar1 = s->cur_func->label_slots + iVar8;
      pLVar1->ref_count = pLVar1->ref_count + -1;
      return 0;
    }
    pcVar12 = "too complicated destructuring expression";
  }
  else {
    if (iVar10 == 0x7b) {
      local_88 = hasval;
      local_84 = iVar8;
      local_7c = iVar9;
      local_68 = sVar2;
      iVar8 = next_token(s);
      if (iVar8 != 0) {
        return -1;
      }
      emit_op(s,'o');
      if (has_ellipsis != 0) {
        emit_op(s,'\v');
        emit_op(s,'\x1b');
      }
      local_78 = (ulong)((tok + 0x37U & 0xfffffff7) == 0);
switchD_00158d7a_caseD_0:
      iVar8 = (s->token).val;
      if (iVar8 == -0x5b) {
        if (has_ellipsis == 0) {
          JS_ThrowInternalError(s->ctx,"unexpected ellipsis token");
          cVar14 = '\x01';
        }
        else {
          iVar8 = next_token(s);
          cVar14 = '\x01';
          if (iVar8 == 0) {
            if (tok == 0) {
              iVar8 = js_parse_postfix_expr(s,2);
              if ((iVar8 == 0) &&
                 (iVar8 = get_lvalue(s,&opcode,&scope,&var_name,&label_lvalue,&depth_lvalue,0,0x7b),
                 iVar8 == 0)) goto LAB_0015876a;
            }
            else {
              var_name = js_parse_destructuring_var(s,local_94,is_arg_00);
              if (var_name != 0) {
                opcode = 0xb6;
                scope = s->cur_func->scope_level;
                label_lvalue = -1;
                depth_lvalue = 0;
LAB_0015876a:
                if ((s->token).val == 0x7d) {
                  emit_op(s,'\v');
                  emit_op(s,'S');
                  dbuf_putc(&s->cur_func->byte_code,
                            (char)(depth_lvalue << 5) + 0x40U | (char)depth_lvalue * '\x04' + 4U);
                  goto LAB_00158c6d;
                }
                js_parse_error(s,"assignment rest property must be last");
                cVar14 = '\x04';
              }
            }
          }
        }
        goto LAB_00158d68;
      }
      if (iVar8 != 0x7d) {
        cVar14 = '\x01';
        iVar8 = js_parse_property_name(s,&prop_name,0,1,0);
        if (-1 < iVar8) {
          var_name = 0;
          opcode = 0xb6;
          scope = s->cur_func->scope_level;
          label_lvalue = -1;
          depth_lvalue = 0;
          if (iVar8 == 0) {
            iVar8 = next_token(s);
            cVar14 = '\x06';
            if (iVar8 == 0) {
              if ((((s->token).val | 0x20U) == 0x7b) &&
                 (((iVar8 = js_parse_skip_parens_token(s,&skip_bits,0), JVar6 = prop_name,
                   iVar8 == 0x2c || (iVar8 == 0x7d)) || (iVar8 == 0x3d)))) {
                if (prop_name == 0) {
                  if (has_ellipsis != 0) {
                    emit_op(s,'p');
                    emit_op(s,'\x18');
                    emit_op(s,'\a');
                    emit_op(s,'Q');
                    emit_op(s,'\x18');
                  }
                  emit_op(s,'H');
                }
                else {
                  if (has_ellipsis != 0) {
                    emit_op(s,'\x1b');
                    emit_op(s,'\a');
                    emit_op(s,'L');
                    emit_atom(s,JVar6);
                    emit_op(s,'\x1b');
                  }
                  emit_op(s,'B');
                  local_58.prev = (BlockEnv *)CONCAT44(local_58.prev._4_4_,JVar6);
                  dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_58,4);
                }
                cVar14 = '\x01';
                iVar8 = js_parse_destructuring_element(s,tok,local_94,1,-1,1);
                if ((-1 < iVar8) && (cVar14 = '\x03', (s->token).val != 0x7d)) {
                  iVar8 = js_parse_expect(s,0x2c);
                  cVar14 = (iVar8 == 0) + '\x01';
                }
              }
              else {
                JVar6 = prop_name;
                if (prop_name == 0) {
                  emit_op(s,'q');
                  if (has_ellipsis != 0) {
                    emit_op(s,'\x18');
                    emit_op(s,'\a');
                    emit_op(s,'Q');
                    val = '\x12';
                    uVar7 = '\x18';
                    goto LAB_00158ae3;
                  }
                  val = '\x12';
                }
                else if (has_ellipsis == 0) {
                  val = '\x11';
                }
                else {
                  emit_op(s,'\x1b');
                  emit_op(s,'\a');
                  emit_op(s,'L');
                  emit_atom(s,JVar6);
                  val = '\x11';
                  uVar7 = '\x1b';
LAB_00158ae3:
                  emit_op(s,uVar7);
                }
                emit_op(s,val);
                if (tok == 0) {
                  iVar8 = js_parse_postfix_expr(s,2);
                  if (iVar8 == 0) goto LAB_00158942;
                }
                else {
                  var_name = js_parse_destructuring_var(s,local_94,is_arg_01);
                  if (var_name != 0) goto LAB_00158c2d;
                }
              }
            }
          }
          else {
            if (local_94 != 0) {
              iVar8 = js_parse_check_duplicate_parameter(s,prop_name);
              cVar14 = '\x06';
              if (iVar8 != 0) goto LAB_00158d68;
            }
            if (((s->cur_func->js_mode & 1) == 0) || ((prop_name != 0x4d && (prop_name != 0x3a)))) {
              if (has_ellipsis != 0) {
                emit_op(s,'\x1b');
                emit_op(s,'\a');
                emit_op(s,'L');
                emit_atom(s,prop_name);
                emit_op(s,'\x1b');
              }
              JVar6 = prop_name;
              if ((tok == 0) || (tok == -0x4f)) {
                emit_op(s,'\x11');
                emit_op(s,0xb6);
                emit_atom(s,prop_name);
                local_58.prev =
                     (BlockEnv *)CONCAT62(local_58.prev._2_6_,(short)s->cur_func->scope_level);
                dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_58,2);
LAB_00158942:
                iVar8 = get_lvalue(s,&opcode,&scope,&var_name,&label_lvalue,&depth_lvalue,0,0x7b);
                cVar14 = '\x06';
                if (iVar8 != 0) goto LAB_00158d68;
                if (prop_name == 0) {
                  if (depth_lvalue == 1) {
                    uVar7 = '\x1e';
                  }
                  else if (depth_lvalue == 3) {
                    emit_op(s,' ');
                    uVar7 = ' ';
                  }
                  else {
                    if (depth_lvalue != 2) goto LAB_00158c2d;
                    uVar7 = '\x1c';
                  }
LAB_00158c22:
                  emit_op(s,uVar7);
                }
                else if (depth_lvalue - 1U < 3) {
                  uVar7 = (char)(depth_lvalue - 1U) * '\x02' + '\x1b';
                  goto LAB_00158c22;
                }
LAB_00158c2d:
                JVar6 = prop_name;
                if (prop_name == 0) {
                  emit_op(s,'G');
                }
                else {
                  emit_op(s,'A');
                  local_58.prev = (BlockEnv *)CONCAT44(local_58.prev._4_4_,JVar6);
                  dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_58,4);
                }
              }
              else {
                if (0xd1 < (long)(int)prop_name) {
                  pJVar3 = s->ctx->rt->atom_array[(int)prop_name];
                  (pJVar3->header).ref_count = (pJVar3->header).ref_count + 1;
                }
                var_name = prop_name;
                emit_op(s,'B');
                local_58.prev = (BlockEnv *)CONCAT44(local_58.prev._4_4_,JVar6);
                dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_58,4);
              }
LAB_00158c6d:
              if (tok != 0) {
                iVar8 = js_define_var(s,var_name,tok);
                cVar14 = '\x04';
                if (iVar8 != 0) goto LAB_00158d68;
                scope = s->cur_func->scope_level;
              }
              if ((s->token).val == 0x3d) {
                emit_op(s,'\x11');
                emit_op(s,'\x06');
                emit_op(s,0xab);
                iVar8 = emit_goto(s,0x69,-1);
                iVar9 = next_token(s);
                cVar14 = '\x04';
                if (iVar9 == 0) {
                  local_8c = iVar8;
                  emit_op(s,'\x0e');
                  iVar8 = js_parse_assign_expr2(s,1);
                  if (iVar8 != 0) goto LAB_00158d11;
                  if ((opcode == 0xb6) || (opcode == 0x3c)) {
                    set_object_name(s,var_name);
                  }
                  emit_label(s,local_8c);
                  cVar14 = '\0';
                  bVar5 = true;
                }
                else {
LAB_00158d11:
                  bVar5 = false;
                }
                if (!bVar5) goto LAB_00158d68;
              }
              put_lvalue(s,opcode,scope,var_name,label_lvalue,PUT_LVALUE_NOKEEP_DEPTH,(BOOL)local_78
                        );
              cVar14 = '\x03';
              if ((s->token).val != 0x7d) {
                iVar8 = js_parse_expect(s,0x2c);
                cVar14 = iVar8 != 0;
              }
            }
            else {
              js_parse_error(s,"invalid destructuring target");
              cVar14 = '\x06';
            }
          }
        }
        goto LAB_00158d68;
      }
      goto switchD_00158d7a_caseD_3;
    }
    pcVar12 = "invalid assignment syntax";
  }
  js_parse_error(s,pcVar12);
LAB_00158e07:
  return -1;
LAB_00158d68:
  switch(cVar14) {
  case '\0':
  case '\x02':
    goto switchD_00158d7a_caseD_0;
  default:
    goto LAB_00158e07;
  case '\x03':
switchD_00158d7a_caseD_3:
    emit_op(s,'\x0e');
    if (has_ellipsis != 0) {
      emit_op(s,'\x0e');
    }
    iVar8 = next_token(s);
    if (iVar8 != 0) {
      return -1;
    }
    goto LAB_001591eb;
  case '\x04':
    goto switchD_00158d7a_caseD_4;
  case '\x06':
    JS_FreeAtom(s->ctx,prop_name);
    goto switchD_00158d7a_caseD_4;
  }
}

Assistant:

static int js_parse_destructuring_element(JSParseState *s, int tok, int is_arg,
                                        int hasval, int has_ellipsis,
                                        BOOL allow_initializer)
{
    int label_parse, label_assign, label_done, label_lvalue, depth_lvalue;
    int start_addr, assign_addr;
    JSAtom prop_name, var_name;
    int opcode, scope, tok1, skip_bits;
    BOOL has_initializer;
    
    if (has_ellipsis < 0) {
        /* pre-parse destructuration target for spread detection */
        js_parse_skip_parens_token(s, &skip_bits, FALSE);
        has_ellipsis = skip_bits & SKIP_HAS_ELLIPSIS;
    }

    label_parse = new_label(s);
    label_assign = new_label(s);

    start_addr = s->cur_func->byte_code.size;
    if (hasval) {
        /* consume value from the stack */
        emit_op(s, OP_dup);
        emit_op(s, OP_undefined);
        emit_op(s, OP_strict_eq);
        emit_goto(s, OP_if_true, label_parse);
        emit_label(s, label_assign);
    } else {
        emit_goto(s, OP_goto, label_parse);
        emit_label(s, label_assign);
        /* leave value on the stack */
        emit_op(s, OP_dup);
    }
    assign_addr = s->cur_func->byte_code.size;
    if (s->token.val == '{') {
        if (next_token(s))
            return -1;
        /* throw an exception if the value cannot be converted to an object */
        emit_op(s, OP_to_object);
        if (has_ellipsis) {
            /* add excludeList on stack just below src object */
            emit_op(s, OP_object);
            emit_op(s, OP_swap);
        }
        while (s->token.val != '}') {
            int prop_type;
            if (s->token.val == TOK_ELLIPSIS) {
                if (!has_ellipsis) {
                    JS_ThrowInternalError(s->ctx, "unexpected ellipsis token");
                    return -1;
                }
                if (next_token(s))
                    return -1;
                if (tok) {
                    var_name = js_parse_destructuring_var(s, tok, is_arg);
                    if (var_name == JS_ATOM_NULL)
                        return -1;
                    opcode = OP_scope_get_var;
                    scope = s->cur_func->scope_level;
                    label_lvalue = -1;
                    depth_lvalue = 0;
                } else {
                    if (js_parse_left_hand_side_expr(s))
                        return -1;

                    if (get_lvalue(s, &opcode, &scope, &var_name,
                                   &label_lvalue, &depth_lvalue, FALSE, '{'))
                        return -1;
                }
                if (s->token.val != '}') {
                    js_parse_error(s, "assignment rest property must be last");
                    goto var_error;
                }
                emit_op(s, OP_object);  /* target */
                emit_op(s, OP_copy_data_properties);
                emit_u8(s, 0 | ((depth_lvalue + 1) << 2) | ((depth_lvalue + 2) << 5));
                goto set_val;
            }
            prop_type = js_parse_property_name(s, &prop_name, FALSE, TRUE, FALSE);
            if (prop_type < 0)
                return -1;
            var_name = JS_ATOM_NULL;
            opcode = OP_scope_get_var;
            scope = s->cur_func->scope_level;
            label_lvalue = -1;
            depth_lvalue = 0;
            if (prop_type == PROP_TYPE_IDENT) {
                if (next_token(s))
                    goto prop_error;
                if ((s->token.val == '[' || s->token.val == '{')
                    &&  ((tok1 = js_parse_skip_parens_token(s, &skip_bits, FALSE)) == ',' ||
                         tok1 == '=' || tok1 == '}')) {
                    if (prop_name == JS_ATOM_NULL) {
                        /* computed property name on stack */
                        if (has_ellipsis) {
                            /* define the property in excludeList */
                            emit_op(s, OP_to_propkey); /* avoid calling ToString twice */
                            emit_op(s, OP_perm3); /* TOS: src excludeList prop */
                            emit_op(s, OP_null); /* TOS: src excludeList prop null */
                            emit_op(s, OP_define_array_el); /* TOS: src excludeList prop */
                            emit_op(s, OP_perm3); /* TOS: excludeList src prop */
                        }
                        /* get the computed property from the source object */
                        emit_op(s, OP_get_array_el2);
                    } else {
                        /* named property */
                        if (has_ellipsis) {
                            /* define the property in excludeList */
                            emit_op(s, OP_swap); /* TOS: src excludeList */
                            emit_op(s, OP_null); /* TOS: src excludeList null */
                            emit_op(s, OP_define_field); /* TOS: src excludeList */
                            emit_atom(s, prop_name);
                            emit_op(s, OP_swap); /* TOS: excludeList src */
                        }
                        /* get the named property from the source object */
                        emit_op(s, OP_get_field2);
                        emit_u32(s, prop_name);
                    }
                    if (js_parse_destructuring_element(s, tok, is_arg, TRUE, -1, TRUE) < 0)
                        return -1;
                    if (s->token.val == '}')
                        break;
                    /* accept a trailing comma before the '}' */
                    if (js_parse_expect(s, ','))
                        return -1;
                    continue;
                }
                if (prop_name == JS_ATOM_NULL) {
                    emit_op(s, OP_to_propkey2);
                    if (has_ellipsis) {
                        /* define the property in excludeList */
                        emit_op(s, OP_perm3);
                        emit_op(s, OP_null);
                        emit_op(s, OP_define_array_el);
                        emit_op(s, OP_perm3);
                    }
                    /* source prop -- source source prop */
                    emit_op(s, OP_dup1);
                } else {
                    if (has_ellipsis) {
                        /* define the property in excludeList */
                        emit_op(s, OP_swap);
                        emit_op(s, OP_null);
                        emit_op(s, OP_define_field);
                        emit_atom(s, prop_name);
                        emit_op(s, OP_swap);
                    }
                    /* source -- source source */
                    emit_op(s, OP_dup);
                }
                if (tok) {
                    var_name = js_parse_destructuring_var(s, tok, is_arg);
                    if (var_name == JS_ATOM_NULL)
                        goto prop_error;
                } else {
                    if (js_parse_left_hand_side_expr(s))
                        goto prop_error;
                lvalue:
                    if (get_lvalue(s, &opcode, &scope, &var_name,
                                   &label_lvalue, &depth_lvalue, FALSE, '{'))
                        goto prop_error;
                    /* swap ref and lvalue object if any */
                    if (prop_name == JS_ATOM_NULL) {
                        switch(depth_lvalue) {
                        case 1:
                            /* source prop x -> x source prop */
                            emit_op(s, OP_rot3r);
                            break;
                        case 2:
                            /* source prop x y -> x y source prop */
                            emit_op(s, OP_swap2);   /* t p2 s p1 */
                            break;
                        case 3:
                            /* source prop x y z -> x y z source prop */
                            emit_op(s, OP_rot5l);
                            emit_op(s, OP_rot5l);
                            break;
                        }
                    } else {
                        switch(depth_lvalue) {
                        case 1:
                            /* source x -> x source */
                            emit_op(s, OP_swap);
                            break;
                        case 2:
                            /* source x y -> x y source */
                            emit_op(s, OP_rot3l);
                            break;
                        case 3:
                            /* source x y z -> x y z source */
                            emit_op(s, OP_rot4l);
                            break;
                        }
                    }
                }
                if (prop_name == JS_ATOM_NULL) {
                    /* computed property name on stack */
                    /* XXX: should have OP_get_array_el2x with depth */
                    /* source prop -- val */
                    emit_op(s, OP_get_array_el);
                } else {
                    /* named property */
                    /* XXX: should have OP_get_field2x with depth */
                    /* source -- val */
                    emit_op(s, OP_get_field);
                    emit_u32(s, prop_name);
                }
            } else {
                /* prop_type = PROP_TYPE_VAR, cannot be a computed property */
                if (is_arg && js_parse_check_duplicate_parameter(s, prop_name))
                    goto prop_error;
                if ((s->cur_func->js_mode & JS_MODE_STRICT) &&
                    (prop_name == JS_ATOM_eval || prop_name == JS_ATOM_arguments)) {
                    js_parse_error(s, "invalid destructuring target");
                    goto prop_error;
                }
                if (has_ellipsis) {
                    /* define the property in excludeList */
                    emit_op(s, OP_swap);
                    emit_op(s, OP_null);
                    emit_op(s, OP_define_field);
                    emit_atom(s, prop_name);
                    emit_op(s, OP_swap);
                }
                if (!tok || tok == TOK_VAR) {
                    /* generate reference */
                    /* source -- source source */
                    emit_op(s, OP_dup);
                    emit_op(s, OP_scope_get_var);
                    emit_atom(s, prop_name);
                    emit_u16(s, s->cur_func->scope_level);
                    goto lvalue;
                }
                var_name = JS_DupAtom(s->ctx, prop_name);
                /* source -- source val */
                emit_op(s, OP_get_field2);
                emit_u32(s, prop_name);
            }
        set_val:
            if (tok) {
                if (js_define_var(s, var_name, tok))
                    goto var_error;
                scope = s->cur_func->scope_level;
            }
            if (s->token.val == '=') {  /* handle optional default value */
                int label_hasval;
                emit_op(s, OP_dup);
                emit_op(s, OP_undefined);
                emit_op(s, OP_strict_eq);
                label_hasval = emit_goto(s, OP_if_false, -1);
                if (next_token(s))
                    goto var_error;
                emit_op(s, OP_drop);
                if (js_parse_assign_expr(s))
                    goto var_error;
                if (opcode == OP_scope_get_var || opcode == OP_get_ref_value)
                    set_object_name(s, var_name);
                emit_label(s, label_hasval);
            }
            /* store value into lvalue object */
            put_lvalue(s, opcode, scope, var_name, label_lvalue,
                       PUT_LVALUE_NOKEEP_DEPTH,
                       (tok == TOK_CONST || tok == TOK_LET));
            if (s->token.val == '}')
                break;
            /* accept a trailing comma before the '}' */
            if (js_parse_expect(s, ','))
                return -1;
        }
        /* drop the source object */
        emit_op(s, OP_drop);
        if (has_ellipsis) {
            emit_op(s, OP_drop); /* pop excludeList */
        }
        if (next_token(s))
            return -1;
    } else if (s->token.val == '[') {
        BOOL has_spread;
        int enum_depth;
        BlockEnv block_env;

        if (next_token(s))
            return -1;
        /* the block environment is only needed in generators in case
           'yield' triggers a 'return' */
        push_break_entry(s->cur_func, &block_env,
                         JS_ATOM_NULL, -1, -1, 2);
        block_env.has_iterator = TRUE;
        emit_op(s, OP_for_of_start);
        has_spread = FALSE;
        while (s->token.val != ']') {
            /* get the next value */
            if (s->token.val == TOK_ELLIPSIS) {
                if (next_token(s))
                    return -1;
                if (s->token.val == ',' || s->token.val == ']')
                    return js_parse_error(s, "missing binding pattern...");
                has_spread = TRUE;
            }
            if (s->token.val == ',') {
                /* do nothing, skip the value, has_spread is false */
                emit_op(s, OP_for_of_next);
                emit_u8(s, 0);
                emit_op(s, OP_drop);
                emit_op(s, OP_drop);
            } else if ((s->token.val == '[' || s->token.val == '{')
                   &&  ((tok1 = js_parse_skip_parens_token(s, &skip_bits, FALSE)) == ',' ||
                        tok1 == '=' || tok1 == ']')) {
                if (has_spread) {
                    if (tok1 == '=')
                        return js_parse_error(s, "rest element cannot have a default value");
                    js_emit_spread_code(s, 0);
                } else {
                    emit_op(s, OP_for_of_next);
                    emit_u8(s, 0);
                    emit_op(s, OP_drop);
                }
                if (js_parse_destructuring_element(s, tok, is_arg, TRUE, skip_bits & SKIP_HAS_ELLIPSIS, TRUE) < 0)
                    return -1;
            } else {
                var_name = JS_ATOM_NULL;
                enum_depth = 0;
                if (tok) {
                    var_name = js_parse_destructuring_var(s, tok, is_arg);
                    if (var_name == JS_ATOM_NULL)
                        goto var_error;
                    if (js_define_var(s, var_name, tok))
                        goto var_error;
                    opcode = OP_scope_get_var;
                    scope = s->cur_func->scope_level;
                } else {
                    if (js_parse_left_hand_side_expr(s))
                        return -1;
                    if (get_lvalue(s, &opcode, &scope, &var_name,
                                   &label_lvalue, &enum_depth, FALSE, '[')) {
                        return -1;
                    }
                }
                if (has_spread) {
                    js_emit_spread_code(s, enum_depth);
                } else {
                    emit_op(s, OP_for_of_next);
                    emit_u8(s, enum_depth);
                    emit_op(s, OP_drop);
                }
                if (s->token.val == '=' && !has_spread) {
                    /* handle optional default value */
                    int label_hasval;
                    emit_op(s, OP_dup);
                    emit_op(s, OP_undefined);
                    emit_op(s, OP_strict_eq);
                    label_hasval = emit_goto(s, OP_if_false, -1);
                    if (next_token(s))
                        goto var_error;
                    emit_op(s, OP_drop);
                    if (js_parse_assign_expr(s))
                        goto var_error;
                    if (opcode == OP_scope_get_var || opcode == OP_get_ref_value)
                        set_object_name(s, var_name);
                    emit_label(s, label_hasval);
                }
                /* store value into lvalue object */
                put_lvalue(s, opcode, scope, var_name,
                           label_lvalue, PUT_LVALUE_NOKEEP_DEPTH,
                           (tok == TOK_CONST || tok == TOK_LET));
            }
            if (s->token.val == ']')
                break;
            if (has_spread)
                return js_parse_error(s, "rest element must be the last one");
            /* accept a trailing comma before the ']' */
            if (js_parse_expect(s, ','))
                return -1;
        }
        /* close iterator object:
           if completed, enum_obj has been replaced by undefined */
        emit_op(s, OP_iterator_close);
        pop_break_entry(s->cur_func);
        if (next_token(s))
            return -1;
    } else {
        return js_parse_error(s, "invalid assignment syntax");
    }
    if (s->token.val == '=' && allow_initializer) {
        label_done = emit_goto(s, OP_goto, -1);
        if (next_token(s))
            return -1;
        emit_label(s, label_parse);
        if (hasval)
            emit_op(s, OP_drop);
        if (js_parse_assign_expr(s))
            return -1;
        emit_goto(s, OP_goto, label_assign);
        emit_label(s, label_done);
        has_initializer = TRUE;
    } else {
        /* normally hasval is true except if
           js_parse_skip_parens_token() was wrong in the parsing */
        //        assert(hasval);
        if (!hasval) {
            js_parse_error(s, "too complicated destructuring expression");
            return -1;
        }
        /* remove test and decrement label ref count */
        memset(s->cur_func->byte_code.buf + start_addr, OP_nop,
               assign_addr - start_addr);
        s->cur_func->label_slots[label_parse].ref_count--;
        has_initializer = FALSE;
    }
    return has_initializer;

 prop_error:
    JS_FreeAtom(s->ctx, prop_name);
 var_error:
    JS_FreeAtom(s->ctx, var_name);
    return -1;
}